

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void string_set(char **out,char *in)

{
  uint uVar1;
  size_t size;
  size_t local_28;
  size_t i;
  size_t insize;
  char *in_local;
  char **out_local;
  
  size = strlen(in);
  uVar1 = string_resize(out,size);
  if (uVar1 != 0) {
    for (local_28 = 0; local_28 != size; local_28 = local_28 + 1) {
      (*out)[local_28] = in[local_28];
    }
  }
  return;
}

Assistant:

static void string_set(char** out, const char* in)
{
  size_t insize = strlen(in), i;
  if(string_resize(out, insize))
  {
    for(i = 0; i != insize; ++i)
    {
      (*out)[i] = in[i];
    }
  }
}